

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O3

bool __thiscall
ON_SubDMesh::GetEdgeCenterPointAndNormal
          (ON_SubDMesh *this,ON_SubDEdge *edge,uint edge_face_index,double *P,double *N)

{
  byte bVar1;
  element_type *peVar2;
  uint *puVar3;
  double *pdVar4;
  double *pdVar5;
  double dVar6;
  bool bVar7;
  uint i;
  uint uVar8;
  uint uVar9;
  ON_SubDFace *this_00;
  ON_SubDEdge *pOVar10;
  ON_SubDVertex *pOVar11;
  ON__UINT_PTR OVar12;
  ON_SubDVertex *pOVar13;
  long lVar14;
  uint grid_side_index;
  long lVar15;
  ON_SubDMeshFragment *this_01;
  uint local_50;
  ON_SubDEdgePtr local_38;
  
  dVar6 = ON_DBL_QNAN;
  if (P != (double *)0x0) {
    *P = ON_DBL_QNAN;
    P[1] = dVar6;
    P[2] = dVar6;
  }
  dVar6 = ON_DBL_QNAN;
  if (N != (double *)0x0) {
    *N = ON_DBL_QNAN;
    N[1] = dVar6;
    N[2] = dVar6;
  }
  if ((edge != (ON_SubDEdge *)0x0) &&
     (this_00 = ON_SubDEdge::Face(edge,edge_face_index), this_00 != (ON_SubDFace *)0x0)) {
    i = ON_SubDFace::EdgeArrayIndex(this_00,edge);
    uVar8 = ON_SubDFace::EdgeCount(this_00);
    if ((i < uVar8) &&
       (peVar2 = (this->m_impl_sp).super___shared_ptr<ON_SubDMeshImpl,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr, peVar2 != (element_type *)0x0)) {
      for (this_01 = peVar2->m_first_fragment; this_01 != (ON_SubDMeshFragment *)0x0;
          this_01 = this_01->m_next_fragment) {
        if (this_01->m_face == this_00) {
          goto LAB_0060a011;
        }
      }
    }
  }
  return false;
LAB_0060a011:
  if (this_01->m_face != this_00) {
    uVar8 = 0xffffffff;
LAB_0060a0f3:
    pdVar4 = this_01->m_P;
    if (pdVar4 == (double *)0x0) {
      return false;
    }
    if (this_01->m_P_stride < 3) {
      return false;
    }
    if ((this_01->m_vertex_count_etc & 0x1fff) <= uVar8) {
      return false;
    }
    lVar15 = this_01->m_N_stride * (ulong)uVar8;
    pdVar5 = this_01->m_N;
    if (P != (double *)0x0) {
      lVar14 = this_01->m_P_stride * (ulong)uVar8;
      *P = pdVar4[lVar14];
      P[1] = pdVar4[lVar14 + 1];
      P[2] = pdVar4[lVar14 + 2];
    }
    if (N == (double *)0x0) {
      return true;
    }
    *N = pdVar5[lVar15];
    N[1] = pdVar5[lVar15 + 1];
    N[2] = pdVar5[lVar15 + 2];
    return true;
  }
  uVar9 = ON_SubDMeshFragment::FaceCornerIndex(this_01);
  grid_side_index = 0;
  do {
    local_38 = ON_SubDMeshFragment::SubDEdgePtr(this_01,grid_side_index);
    pOVar10 = ON_SubDEdgePtr::Edge(&local_38);
    if (pOVar10 == edge) {
      bVar1 = (this_01->m_grid).m_side_segment_count;
      uVar8 = 0xffffffff;
      if ((bVar1 == 0) || (puVar3 = (this_01->m_grid).m_S, puVar3 == (uint *)0x0))
      goto LAB_0060a0cf;
      if (uVar9 != 0xffffffff) {
        pOVar11 = ON_SubDMeshFragment::SubDVertex(this_01,grid_side_index);
        uVar8 = 0xffffffff;
        if (pOVar11 != (ON_SubDVertex *)0x0) {
          OVar12 = ON_SubDFace::EdgeDirection(this_00,i);
          pOVar13 = ON_SubDEdge::Vertex(edge,(uint)(OVar12 != 0));
          local_50 = (uint)bVar1;
          uVar8 = (this_01->m_grid).m_S[((pOVar11 == pOVar13) + grid_side_index) * local_50];
        }
        goto LAB_0060a0cf;
      }
      bVar7 = ON_SubDMeshFragment::IsFullFaceFragment(this_01);
      uVar8 = 0xffffffff;
      if (bVar7) {
        uVar8 = puVar3[(uint)(bVar1 >> 1) + grid_side_index * bVar1];
      }
      goto LAB_0060a0f3;
    }
    grid_side_index = grid_side_index + 1;
  } while (grid_side_index != 4);
  uVar8 = 0xffffffff;
LAB_0060a0cf:
  if ((uVar9 == 0xffffffff) || (uVar8 != 0xffffffff)) goto LAB_0060a0f3;
  this_01 = this_01->m_next_fragment;
  if (this_01 == (ON_SubDMeshFragment *)0x0) {
    return false;
  }
  goto LAB_0060a011;
}

Assistant:

bool ON_SubDMesh::GetEdgeCenterPointAndNormal(
  const class ON_SubDEdge* edge,
  unsigned int edge_face_index,
  double* P,
  double* N
) const
{
  if (nullptr != P)
  {
    P[0] = ON_DBL_QNAN;
    P[1] = ON_DBL_QNAN;
    P[2] = ON_DBL_QNAN;
  }
  if (nullptr != N)
  {
    N[0] = ON_DBL_QNAN;
    N[1] = ON_DBL_QNAN;
    N[2] = ON_DBL_QNAN;
  }
  if (nullptr == edge)
    return false;
  const ON_SubDFace* face = edge->Face(edge_face_index);
  if (nullptr == face)
    return false;
  const unsigned int fei = face->EdgeArrayIndex(edge);
  if (fei >= face->EdgeCount())
    return false;

  unsigned int P_dex = ON_UNSET_UINT_INDEX;

  bool bIsPartialFragment = false;
  const ON_SubDMeshFragment* fragment = nullptr;
  for (
    fragment =  FaceFragment(face);
    nullptr != fragment && fragment->m_face == face;
    fragment = bIsPartialFragment ? fragment->m_next_fragment : nullptr
    )
  {
    bIsPartialFragment = fragment->IsFaceCornerFragment();
    for (unsigned int grid_side_index = 0; grid_side_index < 4; grid_side_index++)
    {
      const ON_SubDEdge* grid_side_edge = fragment->SubDEdge(grid_side_index);
      if (edge != grid_side_edge)
        continue;
      const unsigned int n = fragment->m_grid.m_side_segment_count;
      if (n <= 0 || nullptr == fragment->m_grid.m_S)
        break;
      if (bIsPartialFragment)
      {
        const ON_SubDVertex* v = fragment->SubDVertex(grid_side_index);
        if (nullptr != v)
        {
          const unsigned int evi = (0 == face->EdgeDirection(fei)) ? 0U : 1U;
          if (v == edge->Vertex(evi))
            grid_side_index++;
          P_dex = fragment->m_grid.m_S[grid_side_index*n];
        }
      }
      else if (fragment->IsFullFaceFragment())
      {
        P_dex = fragment->m_grid.m_S[grid_side_index*n + n / 2];
      }
      break;
    }
    if (false == bIsPartialFragment || ON_UNSET_UINT_INDEX != P_dex)
      break;
  }
  if (nullptr == fragment)
    return false;
  if (P_dex >= fragment->PointCount())
    return false;
  const double* fragment_P = fragment->m_P + (P_dex * fragment->m_P_stride);
  const double* fragment_N = fragment->m_N + (P_dex * fragment->m_N_stride);
  if (nullptr != P)
  {
    P[0] = fragment_P[0];
    P[1] = fragment_P[1];
    P[2] = fragment_P[2];
  }
  if (nullptr != N)
  {
    N[0] = fragment_N[0];
    N[1] = fragment_N[1];
    N[2] = fragment_N[2];
  }
  return true;
}